

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::mdc_formatter<spdlog::details::scoped_padder>::format_mdc
          (mdc_formatter<spdlog::details::scoped_padder> *this,mdc_map_t *mdc_map,memory_buf_t *dest
          )

{
  string_view_t view;
  string_view_t view_00;
  string_view_t view_01;
  string_view_t view_02;
  bool bVar1;
  _Self *p_Var2;
  memory_buf_t *dest_00;
  long lVar3;
  char *pcVar4;
  memory_buf_t *pmVar5;
  char *in_RDI;
  scoped_padder p;
  size_t content_size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  const_iterator it;
  _Self last_element;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  scoped_padder *in_stack_fffffffffffffef0;
  memory_buf_t *in_stack_fffffffffffffef8;
  scoped_padder *in_stack_ffffffffffffff10;
  undefined1 local_d0 [96];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  reference local_68;
  reference local_60;
  _Self local_58;
  _Self local_50;
  _Base_ptr local_48;
  _Self local_40 [4];
  char *local_20;
  memory_buf_t *local_18;
  char *local_10;
  scoped_padder *local_8;
  
  local_48 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffee8);
  p_Var2 = std::
           _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator--((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffef0);
  local_40[0]._M_node = p_Var2->_M_node;
  local_50._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffee8);
  while( true ) {
    local_58._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffee8);
    bVar1 = std::operator!=(&local_50,&local_58);
    if (!bVar1) break;
    local_68 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)in_stack_fffffffffffffef0);
    local_70 = &local_68->second;
    local_60 = local_68;
    dest_00 = (memory_buf_t *)std::__cxx11::string::size();
    lVar3 = std::__cxx11::string::size();
    local_d0._88_8_ = dest_00->store_ + lVar3 + -0x1f;
    bVar1 = std::operator!=(&local_50,local_40);
    if (bVar1) {
      local_d0._88_8_ = local_d0._88_8_ + 1;
    }
    scoped_padder::scoped_padder
              (in_stack_ffffffffffffff10,(size_t)in_RDI,(padding_info *)dest_00,
               in_stack_fffffffffffffef8);
    fmt::v10::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    view.size_ = (size_t)in_stack_ffffffffffffff10;
    view.data_ = in_RDI;
    fmt_helper::append_string_view(view,dest_00);
    in_stack_fffffffffffffef8 = (memory_buf_t *)local_d0;
    local_20 = ":";
    local_d0._0_8_ = ":";
    local_18 = in_stack_fffffffffffffef8;
    pcVar4 = (char *)std::char_traits<char>::length((char_type *)0x2dd15e);
    (in_stack_fffffffffffffef8->super_buffer<char>).ptr_ = pcVar4;
    view_00.size_ = (size_t)in_stack_ffffffffffffff10;
    view_00.data_ = in_RDI;
    fmt_helper::append_string_view(view_00,dest_00);
    fmt::v10::basic_string_view<char>::
    basic_string_view<std::char_traits<char>,std::allocator<char>>
              ((basic_string_view<char> *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    view_01.size_ = (size_t)in_stack_ffffffffffffff10;
    view_01.data_ = in_RDI;
    fmt_helper::append_string_view(view_01,dest_00);
    bVar1 = std::operator!=(&local_50,local_40);
    if (bVar1) {
      in_stack_fffffffffffffef0 = (scoped_padder *)&stack0xffffffffffffff10;
      local_10 = " ";
      in_stack_ffffffffffffff10 = (scoped_padder *)0x365da5;
      local_8 = in_stack_fffffffffffffef0;
      pmVar5 = (memory_buf_t *)std::char_traits<char>::length((char_type *)0x2dd20d);
      in_stack_fffffffffffffef0->dest_ = pmVar5;
      view_02.size_ = (size_t)in_stack_ffffffffffffff10;
      view_02.data_ = in_RDI;
      fmt_helper::append_string_view(view_02,dest_00);
    }
    scoped_padder::~scoped_padder(in_stack_fffffffffffffef0);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffef0);
  }
  return;
}

Assistant:

void format_mdc(const mdc::mdc_map_t &mdc_map, memory_buf_t &dest) {
        auto last_element = --mdc_map.end();
        for (auto it = mdc_map.begin(); it != mdc_map.end(); ++it) {
            auto &pair = *it;
            const auto &key = pair.first;
            const auto &value = pair.second;
            size_t content_size = key.size() + value.size() + 1;  // 1 for ':'

            if (it != last_element) {
                content_size++;  // 1 for ' '
            }

            ScopedPadder p(content_size, padinfo_, dest);
            fmt_helper::append_string_view(key, dest);
            fmt_helper::append_string_view(":", dest);
            fmt_helper::append_string_view(value, dest);
            if (it != last_element) {
                fmt_helper::append_string_view(" ", dest);
            }
        }
    }